

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void RemoveLocal(CService *addr)

{
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  UniqueLock<GlobalMutex> criticalblock20;
  Level in_stack_00000100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff5c;
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  *this;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff88;
  CService *in_stack_ffffffffffffff90;
  UniqueLock<GlobalMutex> *in_stack_ffffffffffffff98;
  char *__x;
  LogFlags in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<GlobalMutex>
            ((GlobalMutex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  UniqueLock<GlobalMutex>::UniqueLock
            (in_stack_ffffffffffffff98,(GlobalMutex *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,in_stack_ffffffffffffff7c,SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
            );
  __x = "RemoveLocal(%s)\n";
  CService::ToStringAddrPort_abi_cxx11_(in_stack_ffffffffffffff90);
  this = (map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
          *)&stack0xffffffffffffffd8;
  uVar1 = 2;
  LogPrintFormatInternal<std::__cxx11::string>
            (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc0,in_stack_00000100,in_stack_00000008,in_stack_00000110);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,uVar1));
  std::
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::erase(this,(key_type *)__x);
  UniqueLock<GlobalMutex>::~UniqueLock
            ((UniqueLock<GlobalMutex> *)CONCAT44(in_stack_ffffffffffffff5c,uVar1));
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RemoveLocal(const CService& addr)
{
    LOCK(g_maplocalhost_mutex);
    LogPrintf("RemoveLocal(%s)\n", addr.ToStringAddrPort());
    mapLocalHost.erase(addr);
}